

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddPropertyIdsForScopeSlotArray
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ParseableFunctionInfo *function)

{
  PropertyId value;
  uint32 uVar1;
  PropertyId *pPVar2;
  uint local_30;
  PropertyId propertyId;
  uint i;
  uint32 size;
  ParseableFunctionInfo *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  if (function->scopeSlotArraySize == 0) {
    this_local._4_4_ = 0;
  }
  else {
    propertyId = 0;
    for (local_30 = 0; local_30 < function->scopeSlotArraySize; local_30 = local_30 + 1) {
      pPVar2 = ParseableFunctionInfo::GetPropertyIdsForScopeSlotArray(function);
      value = encodePossiblyBuiltInPropertyId(this,pPVar2[local_30]);
      uVar1 = PrependInt32(this,builder,L"PropertyIdsForScopeSlots",value,(BufferBuilderInt32 **)0x0
                          );
      propertyId = uVar1 + propertyId;
    }
    this_local._4_4_ = propertyId;
  }
  return this_local._4_4_;
}

Assistant:

uint32 AddPropertyIdsForScopeSlotArray(BufferBuilderList & builder, ParseableFunctionInfo* function)
    {
        if (function->scopeSlotArraySize == 0)
        {
            return 0;
        }
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start PropertyIdsForScopeSlotsArray"), magicStartOfPropertyIdsForScopeSlotArray);
#endif

        for (uint i = 0; i < function->scopeSlotArraySize; i++)
        {
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(function->GetPropertyIdsForScopeSlotArray()[i]);
            size += PrependInt32(builder, _u("PropertyIdsForScopeSlots"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End PropertyIdsForScopeSlotsArray"), magicEndOfPropertyIdsForScopeSlotArray);
#endif

        return size;
    }